

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

void __thiscall ON_SN_BLOCK::CullBlockHelper(ON_SN_BLOCK *this)

{
  SN_ELEMENT *pSVar1;
  SN_ELEMENT **ppSVar2;
  ON__UINT64 *pOVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ON__UINT64 OVar7;
  undefined8 uVar8;
  MAP_VALUE *pMVar9;
  ON__UINT32 OVar10;
  ON__UINT8 *pOVar11;
  ON__UINT32 OVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  
  uVar14 = this->m_count;
  if ((ulong)uVar14 != 0) {
    pOVar11 = &this->m_sn[1].m_sn_active;
    lVar16 = 0;
    do {
      if (pOVar11[-0x38] == '\0') {
        uVar13 = -lVar16;
        OVar12 = (ON__UINT32)uVar13;
        if (OVar12 + 1 < uVar14) {
          uVar15 = (ulong)(uVar14 - 1) + lVar16;
          do {
            if (*pOVar11 != '\0') {
              uVar17 = uVar13 & 0xffffffff;
              uVar13 = (ulong)((int)uVar13 + 1);
              this->m_sn[uVar17].m_value.m_u = *(anon_union_8_5_72d3814f_for_m_u *)(pOVar11 + 0x18);
              uVar14 = (((SN_ELEMENT *)(pOVar11 + -0x18))->m_id).Data1;
              uVar4 = *(undefined4 *)(pOVar11 + -0x14);
              uVar5 = *(undefined4 *)(pOVar11 + -0x10);
              uVar6 = *(undefined4 *)(pOVar11 + -0xc);
              OVar7 = *(ON__UINT64 *)(pOVar11 + -8);
              uVar8 = *(undefined8 *)pOVar11;
              OVar12 = ((MAP_VALUE *)(pOVar11 + 0x10))->m_u_type;
              OVar10 = ((MAP_VALUE *)(pOVar11 + 0x10))->m_u32;
              ppSVar2 = &this->m_sn[uVar17].m_next;
              *ppSVar2 = *(SN_ELEMENT **)(pOVar11 + 8);
              pMVar9 = (MAP_VALUE *)(ppSVar2 + 1);
              pMVar9->m_u_type = OVar12;
              pMVar9->m_u32 = OVar10;
              pOVar3 = &this->m_sn[uVar17].m_sn;
              *pOVar3 = OVar7;
              pOVar3[1] = uVar8;
              pSVar1 = this->m_sn + uVar17;
              (pSVar1->m_id).Data1 = uVar14;
              *(undefined4 *)&(pSVar1->m_id).Data2 = uVar4;
              *(undefined4 *)(pSVar1->m_id).Data4 = uVar5;
              *(undefined4 *)((pSVar1->m_id).Data4 + 4) = uVar6;
            }
            OVar12 = (ON__UINT32)uVar13;
            pOVar11 = pOVar11 + 0x38;
            uVar14 = (int)uVar15 - 1;
            uVar15 = (ulong)uVar14;
          } while (uVar14 != 0);
        }
        if (OVar12 != 0) {
          this->m_count = OVar12;
          this->m_purged = 0;
          if (this->m_sorted == 0) {
            return;
          }
          this->m_sn0 = this->m_sn[0].m_sn;
          this->m_sn1 = this->m_sn[OVar12 - 1].m_sn;
          return;
        }
        this->m_count = 0;
        this->m_purged = 0;
        this->m_sorted = 1;
        this->m_sn0 = 0;
        this->m_sn1 = 0;
        return;
      }
      pOVar11 = pOVar11 + 0x38;
      lVar16 = lVar16 + -1;
    } while (-lVar16 != (ulong)uVar14);
  }
  return;
}

Assistant:

void ON_SN_BLOCK::CullBlockHelper()
{
  // Search the m_an[] array for elements whose m_u_type
  // value is zero and remove them from the array.
  //
  // This is a high speed helper function.  
  // The calling function must verify m_purged > 0.
  //
  // This function removes all m_sn[] elements
  // that have 0 == m_sn_active.

  ON__UINT32 i, j;
  for (i = 0; i < m_count; i++ )
  {
    if ( 0 == m_sn[i].m_sn_active )
    {
      for ( j = i+1; j < m_count; j++ )
      {
        if ( m_sn[j].m_sn_active )
        {
          m_sn[i++] = m_sn[j];
        }
      }
      if ( 0 == i )
      {
        EmptyBlock();
      }
      else
      {
        m_count = i;
        m_purged = 0;
        if ( m_sorted )
        {
          m_sn0 = m_sn[0].m_sn;
          m_sn1 = m_sn[m_count-1].m_sn;
        }
      }
      break;
    }
  }
}